

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-emit.c
# Opt level: O1

int fy_emit_push_state(fy_emitter *emit,fy_emitter_state state)

{
  uint uVar1;
  fy_emitter_state *pfVar2;
  
  if (emit->state_stack_alloc <= emit->state_stack_top) {
    pfVar2 = (fy_emitter_state *)0x0;
    if (emit->state_stack != emit->state_stack_inplace) {
      pfVar2 = emit->state_stack;
    }
    pfVar2 = (fy_emitter_state *)realloc(pfVar2,(ulong)emit->state_stack_alloc << 3);
    if (emit->state_stack == emit->state_stack_inplace) {
      memcpy(pfVar2,emit->state_stack,(ulong)emit->state_stack_top << 2);
    }
    emit->state_stack = pfVar2;
    emit->state_stack_alloc = emit->state_stack_alloc << 1;
  }
  pfVar2 = emit->state_stack;
  uVar1 = emit->state_stack_top;
  emit->state_stack_top = uVar1 + 1;
  pfVar2[uVar1] = state;
  return (int)pfVar2;
}

Assistant:

static int fy_emit_push_state(struct fy_emitter *emit, enum fy_emitter_state state) {
    enum fy_emitter_state *states;

    if (emit->state_stack_top >= emit->state_stack_alloc) {
        states = realloc(emit->state_stack == emit->state_stack_inplace ? NULL : emit->state_stack,
                         sizeof(emit->state_stack[0]) * emit->state_stack_alloc * 2);
        if (!state)
            return -1;

        if (emit->state_stack == emit->state_stack_inplace)
            memcpy(states, emit->state_stack, sizeof(emit->state_stack[0]) * emit->state_stack_top);
        emit->state_stack = states;
        emit->state_stack_alloc *= 2;
    }
    emit->state_stack[emit->state_stack_top++] = state;

    return 0;
}